

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmUtilitySourceCommand.cxx
# Opt level: O0

bool __thiscall
cmUtilitySourceCommand::InitialPass
          (cmUtilitySourceCommand *this,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *args,cmExecutionStatus *param_2)

{
  cmMakefile *pcVar1;
  bool bVar2;
  int iVar3;
  uint uVar4;
  size_type sVar5;
  reference pbVar6;
  char *pcVar7;
  cmake *this_00;
  cmCacheManager *this_01;
  ulong uVar8;
  bool local_469;
  bool local_461;
  allocator local_3f1;
  string local_3f0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_3d0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_3b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_390;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_370;
  undefined1 local_350 [8];
  string utilityExecutable;
  allocator local_309;
  string local_308;
  allocator local_2e1;
  string local_2e0;
  string local_2c0 [8];
  string exePath;
  undefined1 local_298 [8];
  string utilityDirectory;
  string local_270;
  undefined1 local_250 [8];
  string cmakeCFGout;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_228;
  undefined1 local_208 [8];
  string file;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1e0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1c0;
  allocator local_199;
  undefined1 local_198 [8];
  string utilitySource;
  undefined1 local_170 [8];
  string relativeSource;
  undefined1 local_148 [8];
  string utilityName;
  cmCacheManager *manager;
  string local_110 [8];
  string msg;
  string local_e8;
  bool local_c2;
  allocator local_c1;
  undefined1 local_c0 [6];
  bool haveCacheValue;
  char *local_a0;
  char *intDir;
  char *cacheValue;
  undefined1 local_88 [8];
  string cacheEntry;
  const_iterator arg;
  allocator local_49;
  string local_48;
  cmExecutionStatus *local_28;
  cmExecutionStatus *param_2_local;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *args_local;
  cmUtilitySourceCommand *this_local;
  
  local_28 = param_2;
  param_2_local = (cmExecutionStatus *)args;
  args_local = (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)this;
  bVar2 = cmCommand::Disallowed
                    (&this->super_cmCommand,CMP0034,
                     "The utility_source command should not be called; see CMP0034.");
  if (bVar2) {
    this_local._7_1_ = 1;
    goto LAB_007b5b55;
  }
  sVar5 = std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::size((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)param_2_local);
  if (sVar5 < 3) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              ((string *)&local_48,"called with incorrect number of arguments",&local_49);
    cmCommand::SetError(&this->super_cmCommand,&local_48);
    std::__cxx11::string::~string((string *)&local_48);
    std::allocator<char>::~allocator((allocator<char> *)&local_49);
    this_local._7_1_ = 0;
    goto LAB_007b5b55;
  }
  cacheEntry.field_2._8_8_ =
       std::
       vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ::begin((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)param_2_local);
  cacheValue = (char *)__gnu_cxx::
                       __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                       ::operator++((__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                     *)((long)&cacheEntry.field_2 + 8),0);
  pbVar6 = __gnu_cxx::
           __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator*((__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                        *)&cacheValue);
  std::__cxx11::string::string((string *)local_88,(string *)pbVar6);
  intDir = cmMakefile::GetDefinition((this->super_cmCommand).Makefile,(string *)local_88);
  pcVar1 = (this->super_cmCommand).Makefile;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)local_c0,"CMAKE_CFG_INTDIR",&local_c1);
  pcVar7 = cmMakefile::GetRequiredDefinition(pcVar1,(string *)local_c0);
  std::__cxx11::string::~string((string *)local_c0);
  std::allocator<char>::~allocator((allocator<char> *)&local_c1);
  local_c2 = false;
  pcVar1 = (this->super_cmCommand).Makefile;
  local_a0 = pcVar7;
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&local_e8,"CMAKE_CROSSCOMPILING",
             (allocator *)(msg.field_2._M_local_buf + 0xf));
  bVar2 = cmMakefile::IsOn(pcVar1,&local_e8);
  std::__cxx11::string::~string((string *)&local_e8);
  std::allocator<char>::~allocator((allocator<char> *)(msg.field_2._M_local_buf + 0xf));
  if (bVar2) {
    local_c2 = intDir != (char *)0x0;
    if (!local_c2) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string
                (local_110,"UTILITY_SOURCE is used in cross compiling mode for ",
                 (allocator *)((long)&manager + 7));
      std::allocator<char>::~allocator((allocator<char> *)((long)&manager + 7));
      std::__cxx11::string::operator+=(local_110,(string *)local_88);
      std::__cxx11::string::operator+=
                (local_110,
                 ". If your intention is to run this executable, you need to preload the cache with the full path to a version of that program, which runs on this build machine."
                );
      pcVar7 = (char *)std::__cxx11::string::c_str();
      cmSystemTools::Message(pcVar7,"Warning");
      std::__cxx11::string::~string(local_110);
    }
  }
  else {
    this_00 = cmMakefile::GetCMakeInstance((this->super_cmCommand).Makefile);
    this_01 = cmake::GetCacheManager(this_00);
    local_461 = false;
    if (intDir != (char *)0x0) {
      pcVar7 = strstr(intDir,"(IntDir)");
      if (pcVar7 == (char *)0x0) {
LAB_007b50e2:
        uVar4 = cmCacheManager::GetCacheMajorVersion(this_01);
        local_469 = false;
        if (uVar4 != 0) {
          uVar4 = cmCacheManager::GetCacheMinorVersion(this_01);
          local_469 = uVar4 != 0;
        }
        local_461 = local_469;
      }
      else {
        local_461 = false;
        if (local_a0 != (char *)0x0) {
          iVar3 = strcmp(local_a0,"$(IntDir)");
          local_461 = false;
          if (iVar3 == 0) goto LAB_007b50e2;
        }
      }
    }
    local_c2 = local_461;
  }
  if ((local_c2 & 1U) == 0) {
    relativeSource.field_2._8_8_ =
         __gnu_cxx::
         __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
         ::operator++((__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                       *)((long)&cacheEntry.field_2 + 8),0);
    pbVar6 = __gnu_cxx::
             __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator*((__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                          *)((long)&relativeSource.field_2 + 8));
    std::__cxx11::string::string((string *)local_148,(string *)pbVar6);
    utilitySource.field_2._8_8_ =
         __gnu_cxx::
         __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
         ::operator++((__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                       *)((long)&cacheEntry.field_2 + 8),0);
    pbVar6 = __gnu_cxx::
             __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator*((__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                          *)((long)&utilitySource.field_2 + 8));
    std::__cxx11::string::string((string *)local_170,(string *)pbVar6);
    pcVar7 = cmMakefile::GetCurrentSourceDirectory((this->super_cmCommand).Makefile);
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)local_198,pcVar7,&local_199);
    std::allocator<char>::~allocator((allocator<char> *)&local_199);
    std::operator+(&local_1e0,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_198,
                   "/");
    std::operator+(&local_1c0,&local_1e0,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_170);
    std::__cxx11::string::operator=((string *)local_198,(string *)&local_1c0);
    std::__cxx11::string::~string((string *)&local_1c0);
    std::__cxx11::string::~string((string *)&local_1e0);
    pcVar7 = (char *)std::__cxx11::string::c_str();
    bVar2 = cmsys::SystemTools::FileExists(pcVar7);
    if (bVar2) {
      do {
        file.field_2._8_8_ =
             std::
             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::end((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)param_2_local);
        bVar2 = __gnu_cxx::operator!=
                          ((__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                            *)((long)&cacheEntry.field_2 + 8),
                           (__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                            *)((long)&file.field_2 + 8));
        if (!bVar2) {
          pcVar1 = (this->super_cmCommand).Makefile;
          std::allocator<char>::allocator();
          std::__cxx11::string::string
                    ((string *)&local_270,"CMAKE_CFG_INTDIR",
                     (allocator *)(utilityDirectory.field_2._M_local_buf + 0xf));
          pcVar7 = cmMakefile::GetRequiredDefinition(pcVar1,&local_270);
          std::allocator<char>::allocator();
          std::__cxx11::string::string
                    ((string *)local_250,pcVar7,
                     (allocator *)(utilityDirectory.field_2._M_local_buf + 0xe));
          std::allocator<char>::~allocator
                    ((allocator<char> *)(utilityDirectory.field_2._M_local_buf + 0xe));
          std::__cxx11::string::~string((string *)&local_270);
          std::allocator<char>::~allocator
                    ((allocator<char> *)(utilityDirectory.field_2._M_local_buf + 0xf));
          pcVar7 = cmMakefile::GetCurrentBinaryDirectory((this->super_cmCommand).Makefile);
          std::allocator<char>::allocator();
          std::__cxx11::string::string
                    ((string *)local_298,pcVar7,(allocator *)(exePath.field_2._M_local_buf + 0xf));
          std::allocator<char>::~allocator((allocator<char> *)(exePath.field_2._M_local_buf + 0xf));
          std::__cxx11::string::string(local_2c0);
          pcVar1 = (this->super_cmCommand).Makefile;
          std::allocator<char>::allocator();
          std::__cxx11::string::string((string *)&local_2e0,"EXECUTABLE_OUTPUT_PATH",&local_2e1);
          pcVar7 = cmMakefile::GetDefinition(pcVar1,&local_2e0);
          std::__cxx11::string::~string((string *)&local_2e0);
          std::allocator<char>::~allocator((allocator<char> *)&local_2e1);
          if (pcVar7 != (char *)0x0) {
            pcVar1 = (this->super_cmCommand).Makefile;
            std::allocator<char>::allocator();
            std::__cxx11::string::string((string *)&local_308,"EXECUTABLE_OUTPUT_PATH",&local_309);
            pcVar7 = cmMakefile::GetDefinition(pcVar1,&local_308);
            std::__cxx11::string::operator=(local_2c0,pcVar7);
            std::__cxx11::string::~string((string *)&local_308);
            std::allocator<char>::~allocator((allocator<char> *)&local_309);
          }
          uVar8 = std::__cxx11::string::empty();
          if ((uVar8 & 1) == 0) {
            std::__cxx11::string::operator=((string *)local_298,local_2c0);
          }
          else {
            std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           ((long)&utilityExecutable.field_2 + 8),"/",
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           local_170);
            std::__cxx11::string::operator+=
                      ((string *)local_298,(string *)(utilityExecutable.field_2._M_local_buf + 8));
            std::__cxx11::string::~string((string *)(utilityExecutable.field_2._M_local_buf + 8));
          }
          std::operator+(&local_3d0,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         local_298,"/");
          std::operator+(&local_3b0,&local_3d0,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         local_250);
          std::operator+(&local_390,&local_3b0,"/");
          std::operator+(&local_370,&local_390,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         local_148);
          pcVar1 = (this->super_cmCommand).Makefile;
          std::allocator<char>::allocator();
          std::__cxx11::string::string((string *)&local_3f0,"CMAKE_EXECUTABLE_SUFFIX",&local_3f1);
          pcVar7 = cmMakefile::GetDefinition(pcVar1,&local_3f0);
          std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         local_350,&local_370,pcVar7);
          std::__cxx11::string::~string((string *)&local_3f0);
          std::allocator<char>::~allocator((allocator<char> *)&local_3f1);
          std::__cxx11::string::~string((string *)&local_370);
          std::__cxx11::string::~string((string *)&local_390);
          std::__cxx11::string::~string((string *)&local_3b0);
          std::__cxx11::string::~string((string *)&local_3d0);
          cmsys::SystemTools::ReplaceString((string *)local_350,"/./","/");
          pcVar1 = (this->super_cmCommand).Makefile;
          pcVar7 = (char *)std::__cxx11::string::c_str();
          cmMakefile::AddCacheDefinition
                    (pcVar1,(string *)local_88,pcVar7,"Path to an internal program.",FILEPATH,false)
          ;
          cmsys::SystemTools::ConvertToUnixSlashes((string *)local_350);
          pcVar1 = (this->super_cmCommand).Makefile;
          pcVar7 = (char *)std::__cxx11::string::c_str();
          cmMakefile::AddCacheDefinition
                    (pcVar1,(string *)local_350,pcVar7,"Executable to project name.",INTERNAL,false)
          ;
          this_local._7_1_ = 1;
          utilityName.field_2._12_4_ = 1;
          std::__cxx11::string::~string((string *)local_350);
          std::__cxx11::string::~string(local_2c0);
          std::__cxx11::string::~string((string *)local_298);
          std::__cxx11::string::~string((string *)local_250);
          break;
        }
        std::operator+(&local_228,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       local_198,"/");
        cmakeCFGout.field_2._8_8_ =
             __gnu_cxx::
             __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator++((__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                           *)((long)&cacheEntry.field_2 + 8),0);
        pbVar6 = __gnu_cxx::
                 __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                 ::operator*((__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                              *)((long)&cmakeCFGout.field_2 + 8));
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       local_208,&local_228,pbVar6);
        std::__cxx11::string::~string((string *)&local_228);
        pcVar7 = (char *)std::__cxx11::string::c_str();
        bVar2 = cmsys::SystemTools::FileExists(pcVar7);
        if (!bVar2) {
          this_local._7_1_ = 1;
        }
        utilityName.field_2._13_3_ = 0;
        utilityName.field_2._M_local_buf[0xc] = !bVar2;
        std::__cxx11::string::~string((string *)local_208);
      } while (utilityName.field_2._12_4_ == 0);
    }
    else {
      this_local._7_1_ = 1;
      utilityName.field_2._12_4_ = 1;
    }
    std::__cxx11::string::~string((string *)local_198);
    std::__cxx11::string::~string((string *)local_170);
    std::__cxx11::string::~string((string *)local_148);
  }
  else {
    this_local._7_1_ = 1;
    utilityName.field_2._12_4_ = 1;
  }
  std::__cxx11::string::~string((string *)local_88);
LAB_007b5b55:
  return (bool)(this_local._7_1_ & 1);
}

Assistant:

bool cmUtilitySourceCommand
::InitialPass(std::vector<std::string> const& args, cmExecutionStatus &)
{
  if(this->Disallowed(cmPolicies::CMP0034,
      "The utility_source command should not be called; see CMP0034."))
    { return true; }
  if(args.size() < 3)
    {
    this->SetError("called with incorrect number of arguments");
    return false;
    }

  std::vector<std::string>::const_iterator arg = args.begin();

  // The first argument is the cache entry name.
  std::string cacheEntry = *arg++;
  const char* cacheValue =
    this->Makefile->GetDefinition(cacheEntry);
  // If it exists already and appears up to date then we are done.  If
  // the string contains "(IntDir)" but that is not the
  // CMAKE_CFG_INTDIR setting then the value is out of date.
  const char* intDir =
    this->Makefile->GetRequiredDefinition("CMAKE_CFG_INTDIR");

  bool haveCacheValue = false;
  if (this->Makefile->IsOn("CMAKE_CROSSCOMPILING"))
    {
    haveCacheValue = (cacheValue != 0);
    if (!haveCacheValue)
      {
      std::string msg = "UTILITY_SOURCE is used in cross compiling mode for ";
      msg += cacheEntry;
      msg += ". If your intention is to run this executable, you need to "
            "preload the cache with the full path to a version of that "
            "program, which runs on this build machine.";
      cmSystemTools::Message(msg.c_str() ,"Warning");
      }
    }
  else
    {
    cmCacheManager *manager =
        this->Makefile->GetCMakeInstance()->GetCacheManager();
    haveCacheValue = (cacheValue &&
     (strstr(cacheValue, "(IntDir)") == 0 ||
      (intDir && strcmp(intDir, "$(IntDir)") == 0)) &&
     (manager->GetCacheMajorVersion() != 0 &&
      manager->GetCacheMinorVersion() != 0 ));
    }

  if(haveCacheValue)
    {
    return true;
    }

  // The second argument is the utility's executable name, which will be
  // needed later.
  std::string utilityName = *arg++;

  // The third argument specifies the relative directory of the source
  // of the utility.
  std::string relativeSource = *arg++;
  std::string utilitySource = this->Makefile->GetCurrentSourceDirectory();
  utilitySource = utilitySource+"/"+relativeSource;

  // If the directory doesn't exist, the source has not been included.
  if(!cmSystemTools::FileExists(utilitySource.c_str()))
    { return true; }

  // Make sure all the files exist in the source directory.
  while(arg != args.end())
    {
    std::string file = utilitySource+"/"+*arg++;
    if(!cmSystemTools::FileExists(file.c_str()))
      { return true; }
    }

  // The source exists.
  std::string cmakeCFGout =
    this->Makefile->GetRequiredDefinition("CMAKE_CFG_INTDIR");
  std::string utilityDirectory = this->Makefile->GetCurrentBinaryDirectory();
  std::string exePath;
  if (this->Makefile->GetDefinition("EXECUTABLE_OUTPUT_PATH"))
    {
    exePath = this->Makefile->GetDefinition("EXECUTABLE_OUTPUT_PATH");
    }
  if(!exePath.empty())
    {
    utilityDirectory = exePath;
    }
  else
    {
    utilityDirectory += "/"+relativeSource;
    }

  // Construct the cache entry for the executable's location.
  std::string utilityExecutable =
    utilityDirectory+"/"+cmakeCFGout+"/"
    +utilityName+this->Makefile->GetDefinition("CMAKE_EXECUTABLE_SUFFIX");

  // make sure we remove any /./ in the name
  cmSystemTools::ReplaceString(utilityExecutable, "/./", "/");

  // Enter the value into the cache.
  this->Makefile->AddCacheDefinition(cacheEntry,
                                 utilityExecutable.c_str(),
                                 "Path to an internal program.",
                                 cmState::FILEPATH);
  // add a value into the cache that maps from the
  // full path to the name of the project
  cmSystemTools::ConvertToUnixSlashes(utilityExecutable);
  this->Makefile->AddCacheDefinition(utilityExecutable,
                                 utilityName.c_str(),
                                 "Executable to project name.",
                                 cmState::INTERNAL);

  return true;
}